

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::Renderer::renderStockPileUncoveredCards
          (Renderer *this,Cards *pileCards,SelectedCardIndex *selectedCardIndex,
          StockPileCollider *collider)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  const_reference card;
  Position uncoveredCardsPosition;
  Position cardPosition;
  StockPileCollider *collider_local;
  SelectedCardIndex *selectedCardIndex_local;
  Cards *pileCards_local;
  Renderer *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)selectedCardIndex);
  if (bVar1) {
    uncoveredCardsPosition.x = 0x69;
    uncoveredCardsPosition.y = 0x1e;
    iVar2 = (*collider->_vptr_StockPileCollider[5])();
    while (uncoveredCardsPosition.x <= iVar2) {
      puVar3 = std::optional<unsigned_int>::value(selectedCardIndex);
      card = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::
             operator[](pileCards,(ulong)*puVar3);
      renderCard(this,&uncoveredCardsPosition,card);
      uncoveredCardsPosition.x = uncoveredCardsPosition.x + 2;
    }
  }
  return;
}

Assistant:

void Renderer::renderStockPileUncoveredCards(
    const Cards& pileCards, const SelectedCardIndex& selectedCardIndex,
    const StockPileCollider& collider) const
{
    if (not selectedCardIndex) return;

    auto cardPosition = Layout::stockPilePosition;
    cardPosition.x += Layout::pilesSpacing;
    const auto uncoveredCardsPosition = collider.getUncoveredCardsPosition();

    while (cardPosition.x <= uncoveredCardsPosition.x) {
        renderCard(cardPosition, pileCards[selectedCardIndex.value()]);
        cardPosition.x += Layout::stockPileCardsSpacing;
    }
}